

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int syncJournal(Pager *pPager,int newHdr)

{
  uint uVar1;
  long lVar2;
  PCache *pPVar3;
  PgHdr *pPVar4;
  sqlite3_io_methods *psVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  i64 iVar9;
  PCache *pPVar10;
  sqlite3_io_methods *psVar11;
  sqlite3_file *psVar12;
  long in_FS_OFFSET;
  u8 zHeader [12];
  u8 aMagic [8];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = sqlite3PagerExclusiveLock(pPager);
  if (iVar7 != 0) goto LAB_00128023;
  if (pPager->noSync == '\0') {
    psVar12 = pPager->jfd;
    psVar11 = psVar12->pMethods;
    if ((psVar11 == (sqlite3_io_methods *)0x0) || (pPager->journalMode == '\x04')) {
      pPager->journalHdr = pPager->journalOff;
    }
    else {
      psVar5 = pPager->fd->pMethods;
      if (psVar5 == (sqlite3_io_methods *)0x0) {
        uVar8 = 0;
LAB_00128071:
        zHeader[0] = 0xd9;
        zHeader[1] = 0xd5;
        zHeader[2] = '\x05';
        zHeader[3] = 0xf9;
        zHeader[4] = ' ';
        zHeader[5] = 0xa1;
        zHeader[6] = 'c';
        zHeader[7] = 0xd7;
        uVar1 = pPager->nRec;
        zHeader._8_4_ =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        iVar9 = journalHdrOffset(pPager);
        iVar7 = (*psVar11->xRead)(psVar12,aMagic,8,iVar9);
        if (iVar7 == 0) {
          if (aMagic == (u8  [8])0xd763a120f905d5d9) {
            iVar7 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,"",1,iVar9);
            goto LAB_001280aa;
          }
        }
        else {
LAB_001280aa:
          if ((iVar7 != 0x20a) && (iVar7 != 0)) goto LAB_00128023;
        }
        if ((((uVar8 >> 10 & 1) == 0) &&
            (((pPager->fullSync != '\0' && (pPager->syncFlags != 0)) &&
             (iVar7 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags),
             iVar7 != 0)))) ||
           (iVar7 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,zHeader,0xc,pPager->journalHdr),
           iVar7 != 0)) goto LAB_00128023;
        bVar6 = false;
      }
      else {
        uVar8 = (*psVar5->xDeviceCharacteristics)(pPager->fd);
        bVar6 = true;
        if ((uVar8 >> 9 & 1) == 0) {
          psVar12 = pPager->jfd;
          psVar11 = psVar12->pMethods;
          goto LAB_00128071;
        }
      }
      if ((((uVar8 >> 10 & 1) == 0) &&
          (uVar8 = (uint)(pPager->syncFlags == 3) << 4 | (uint)pPager->syncFlags, uVar8 != 0)) &&
         (iVar7 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,uVar8), iVar7 != 0))
      goto LAB_00128023;
      pPager->journalHdr = pPager->journalOff;
      if (newHdr != 0 && !bVar6) {
        pPager->nRec = 0;
        iVar7 = writeJournalHdr(pPager);
        if (iVar7 != 0) goto LAB_00128023;
      }
    }
  }
  pPVar3 = pPager->pPCache;
  pPVar10 = pPVar3;
  while (pPVar4 = pPVar10->pDirty, pPVar4 != (PgHdr *)0x0) {
    *(byte *)&pPVar4->flags = (byte)pPVar4->flags & 0xf7;
    pPVar10 = (PCache *)&pPVar4->pDirtyNext;
  }
  pPVar3->pSynced = pPVar3->pDirtyTail;
  pPager->eState = '\x04';
  iVar7 = 0;
LAB_00128023:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int syncJournal(Pager *pPager, int newHdr){
  int rc;                         /* Return code */

  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( !pagerUseWal(pPager) );

  rc = sqlite3PagerExclusiveLock(pPager);
  if( rc!=SQLITE_OK ) return rc;

  if( !pPager->noSync ){
    assert( !pPager->tempFile );
    if( isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
      const int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      assert( isOpen(pPager->jfd) );

      if( 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        /* This block deals with an obscure problem. If the last connection
        ** that wrote to this database was operating in persistent-journal
        ** mode, then the journal file may at this point actually be larger
        ** than Pager.journalOff bytes. If the next thing in the journal
        ** file happens to be a journal-header (written as part of the
        ** previous connection's transaction), and a crash or power-failure
        ** occurs after nRec is updated but before this connection writes
        ** anything else to the journal file (or commits/rolls back its
        ** transaction), then SQLite may become confused when doing the
        ** hot-journal rollback following recovery. It may roll back all
        ** of this connections data, then proceed to rolling back the old,
        ** out-of-date data that follows it. Database corruption.
        **
        ** To work around this, if the journal file does appear to contain
        ** a valid header following Pager.journalOff, then write a 0x00
        ** byte to the start of it to prevent it from being recognized.
        **
        ** Variable iNextHdrOffset is set to the offset at which this
        ** problematic header will occur, if it exists. aMagic is used
        ** as a temporary buffer to inspect the first couple of bytes of
        ** the potential journal header.
        */
        i64 iNextHdrOffset;
        u8 aMagic[8];
        u8 zHeader[sizeof(aJournalMagic)+4];

        memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
        put32bits(&zHeader[sizeof(aJournalMagic)], pPager->nRec);

        iNextHdrOffset = journalHdrOffset(pPager);
        rc = sqlite3OsRead(pPager->jfd, aMagic, 8, iNextHdrOffset);
        if( rc==SQLITE_OK && 0==memcmp(aMagic, aJournalMagic, 8) ){
          static const u8 zerobyte = 0;
          rc = sqlite3OsWrite(pPager->jfd, &zerobyte, 1, iNextHdrOffset);
        }
        if( rc!=SQLITE_OK && rc!=SQLITE_IOERR_SHORT_READ ){
          return rc;
        }

        /* Write the nRec value into the journal file header. If in
        ** full-synchronous mode, sync the journal first. This ensures that
        ** all data has really hit the disk before nRec is updated to mark
        ** it as a candidate for rollback.
        **
        ** This is not required if the persistent media supports the
        ** SAFE_APPEND property. Because in this case it is not possible
        ** for garbage data to be appended to the file, the nRec field
        ** is populated with 0xFFFFFFFF when the journal header is written
        ** and never needs to be updated.
        */
        if( pPager->fullSync && 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
          PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
          IOTRACE(("JSYNC %p\n", pPager))
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
          if( rc!=SQLITE_OK ) return rc;
        }
        IOTRACE(("JHDR %p %lld\n", pPager, pPager->journalHdr));
        rc = sqlite3OsWrite(
            pPager->jfd, zHeader, sizeof(zHeader), pPager->journalHdr
        );
        if( rc!=SQLITE_OK ) return rc;
      }
      if( 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
        PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
        IOTRACE(("JSYNC %p\n", pPager))
        rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags|
          (pPager->syncFlags==SQLITE_SYNC_FULL?SQLITE_SYNC_DATAONLY:0)
        );
        if( rc!=SQLITE_OK ) return rc;
      }

      pPager->journalHdr = pPager->journalOff;
      if( newHdr && 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        pPager->nRec = 0;
        rc = writeJournalHdr(pPager);
        if( rc!=SQLITE_OK ) return rc;
      }
    }else{
      pPager->journalHdr = pPager->journalOff;
    }
  }

  /* Unless the pager is in noSync mode, the journal file was just
  ** successfully synced. Either way, clear the PGHDR_NEED_SYNC flag on
  ** all pages.
  */
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = PAGER_WRITER_DBMOD;
  assert( assert_pager_state(pPager) );
  return SQLITE_OK;
}